

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool Cubic_To(black_PWorker worker,Long cx1,Long cy1,Long cx2,Long cy2,Long x,Long y)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  Long LVar4;
  bool overshoot;
  Bool BVar5;
  char cVar6;
  TStates aState;
  TPoint *pTStack_6b0;
  Bool o;
  TPoint *arc;
  TPoint arcs [97];
  long lStack_88;
  TStates state_bez;
  Long ymax2;
  Long ymin2;
  Long ymax1;
  Long ymin1;
  Long x4;
  Long y4;
  Long y3;
  Long y2;
  Long y1;
  Long x_local;
  Long cy2_local;
  Long cx2_local;
  Long cy1_local;
  Long cx1_local;
  black_PWorker worker_local;
  
  pTStack_6b0 = (TPoint *)&arc;
  arcs[2].y = worker->lastX;
  arcs[3].x = worker->lastY;
  arcs[1].y = cx1;
  arcs[2].x = cy1;
  arcs[0].y = cx2;
  arcs[1].x = cy2;
  arc = (TPoint *)x;
  arcs[0].x = y;
  do {
    uVar1 = pTStack_6b0[3].y;
    lVar2 = pTStack_6b0[2].y;
    ymax2 = pTStack_6b0[1].y;
    uVar3 = pTStack_6b0->y;
    LVar4 = pTStack_6b0->x;
    ymin2 = uVar1;
    ymax1 = uVar3;
    if ((long)uVar1 <= (long)uVar3) {
      ymin2 = uVar3;
      ymax1 = uVar1;
    }
    lStack_88 = lVar2;
    if (lVar2 <= ymax2) {
      lStack_88 = ymax2;
      ymax2 = lVar2;
    }
    if ((ymax2 < ymax1) || (ymin2 < lStack_88)) {
      Split_Cubic(pTStack_6b0);
      pTStack_6b0 = pTStack_6b0 + 3;
    }
    else {
      if (uVar1 != uVar3) {
        aState = Descending_State;
        if ((long)uVar1 <= (long)uVar3) {
          aState = Ascending_State;
        }
        if (worker->state != aState) {
          if (aState == Ascending_State) {
            overshoot = (long)worker->precision_half <=
                        (long)(((uVar1 + (long)worker->precision) - 1 & (long)-worker->precision) -
                              uVar1);
          }
          else {
            overshoot = (long)worker->precision_half <=
                        (long)(uVar1 - (uVar1 & (long)-worker->precision));
          }
          if ((worker->state != Unknown_State) &&
             (BVar5 = End_Profile(worker,overshoot), BVar5 != '\0')) {
            return '\x01';
          }
          BVar5 = New_Profile(worker,aState,overshoot);
          if (BVar5 != '\0') {
            return '\x01';
          }
        }
        if (aState == Ascending_State) {
          cVar6 = Bezier_Up(worker,3,pTStack_6b0,Split_Cubic,worker->minY,worker->maxY);
        }
        else {
          cVar6 = Bezier_Down(worker,3,pTStack_6b0,Split_Cubic,worker->minY,worker->maxY);
        }
        if (cVar6 != '\0') {
          return '\x01';
        }
      }
      pTStack_6b0 = pTStack_6b0 + -3;
    }
    if (pTStack_6b0 < (TPoint *)&arc) {
      worker->lastX = LVar4;
      worker->lastY = uVar3;
      return '\0';
    }
  } while( true );
}

Assistant:

static Bool
  Cubic_To( RAS_ARGS Long  cx1,
                     Long  cy1,
                     Long  cx2,
                     Long  cy2,
                     Long  x,
                     Long  y )
  {
    Long     y1, y2, y3, y4, x4, ymin1, ymax1, ymin2, ymax2;
    TStates  state_bez;
    TPoint   arcs[3 * MaxBezier + 1]; /* The Bezier stack           */
    TPoint*  arc;                     /* current Bezier arc pointer */


    arc      = arcs;
    arc[3].x = ras.lastX;
    arc[3].y = ras.lastY;
    arc[2].x = cx1;
    arc[2].y = cy1;
    arc[1].x = cx2;
    arc[1].y = cy2;
    arc[0].x = x;
    arc[0].y = y;

    do
    {
      y1 = arc[3].y;
      y2 = arc[2].y;
      y3 = arc[1].y;
      y4 = arc[0].y;
      x4 = arc[0].x;

      /* first, categorize the Bezier arc */

      if ( y1 <= y4 )
      {
        ymin1 = y1;
        ymax1 = y4;
      }
      else
      {
        ymin1 = y4;
        ymax1 = y1;
      }

      if ( y2 <= y3 )
      {
        ymin2 = y2;
        ymax2 = y3;
      }
      else
      {
        ymin2 = y3;
        ymax2 = y2;
      }

      if ( ymin2 < ymin1 || ymax2 > ymax1 )
      {
        /* this arc has no given direction, split it! */
        Split_Cubic( arc );
        arc += 3;
      }
      else if ( y1 == y4 )
      {
        /* this arc is flat, ignore it and pop it from the Bezier stack */
        arc -= 3;
      }
      else
      {
        state_bez = ( y1 <= y4 ) ? Ascending_State : Descending_State;

        /* detect a change of direction */
        if ( ras.state != state_bez )
        {
          Bool  o = ( state_bez == Ascending_State )
                      ? IS_BOTTOM_OVERSHOOT( y1 )
                      : IS_TOP_OVERSHOOT( y1 );


          /* finalize current profile if any */
          if ( ras.state != Unknown_State &&
               End_Profile( RAS_VARS o )  )
            goto Fail;

          if ( New_Profile( RAS_VARS state_bez, o ) )
            goto Fail;
        }

        /* compute intersections */
        if ( state_bez == Ascending_State )
        {
          if ( Bezier_Up( RAS_VARS 3, arc, Split_Cubic,
                                   ras.minY, ras.maxY ) )
            goto Fail;
        }
        else
          if ( Bezier_Down( RAS_VARS 3, arc, Split_Cubic,
                                     ras.minY, ras.maxY ) )
            goto Fail;
        arc -= 3;
      }

    } while ( arc >= arcs );

    ras.lastX = x4;
    ras.lastY = y4;

    return SUCCESS;

  Fail:
    return FAILURE;
  }